

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

timediff_t Curl_pp_state_timeout(Curl_easy *data,pingpong *pp,_Bool disconnecting)

{
  connectdata *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  timediff_t tVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  curltime cVar10;
  curltime cVar11;
  curltime newer;
  curltime newer_00;
  
  uVar7 = (ulong)(data->set).server_response_timeout;
  if (uVar7 == 0) {
    uVar7 = pp->response_time;
  }
  pcVar1 = data->conn;
  cVar10 = Curl_now();
  uVar2 = (pp->response).tv_sec;
  uVar3 = (pp->response).tv_usec;
  cVar11.tv_usec = uVar3;
  cVar11.tv_sec = uVar2;
  cVar11._12_4_ = 0;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar10._0_12_,0);
  newer.tv_usec = SUB124(cVar10._0_12_,8);
  tVar6 = Curl_timediff(newer,cVar11);
  lVar8 = uVar7 - tVar6;
  uVar7 = (ulong)(data->set).timeout;
  lVar9 = lVar8;
  if (uVar7 != 0 && !disconnecting) {
    cVar11 = Curl_now();
    uVar4 = (pcVar1->now).tv_sec;
    uVar5 = (pcVar1->now).tv_usec;
    cVar10.tv_usec = uVar5;
    cVar10.tv_sec = uVar4;
    cVar10._12_4_ = 0;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = SUB128(cVar11._0_12_,0);
    newer_00.tv_usec = SUB124(cVar11._0_12_,8);
    tVar6 = Curl_timediff(newer_00,cVar10);
    lVar9 = uVar7 - tVar6;
    if (lVar8 < lVar9) {
      lVar9 = lVar8;
    }
  }
  return lVar9;
}

Assistant:

timediff_t Curl_pp_state_timeout(struct Curl_easy *data,
                                 struct pingpong *pp, bool disconnecting)
{
  struct connectdata *conn = data->conn;
  timediff_t timeout_ms; /* in milliseconds */
  timediff_t response_time = (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    Curl_timediff(Curl_now(), pp->response); /* spent time */

  if(data->set.timeout && !disconnecting) {
    /* if timeout is requested, find out how much remaining time we have */
    timediff_t timeout2_ms = data->set.timeout - /* timeout time */
      Curl_timediff(Curl_now(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}